

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O0

void graceful_shutdown(int signum,siginfo_t *info,void *ptr)

{
  void *ptr_local;
  siginfo_t *info_local;
  int signum_local;
  
  proxy_log(&ph,3,"Caught signal\n");
  if ((signum == 0xf) || (signum == 2)) {
    sentinel = '\x01';
  }
  if (((signum == 0xf) || (signum == 2)) || (signum == 10)) {
    proxy_shutdown(&ph);
  }
  return;
}

Assistant:

static void graceful_shutdown(int signum, siginfo_t *info, void *ptr)
{
	proxy_log(&ph, LOG_LEVEL_INFO, "Caught signal\n");
	(void)info;
	(void)ptr;

	if (signum == SIGTERM || signum == SIGINT)
		sentinel = 1;

	if (signum == SIGTERM || signum == SIGINT || signum == SIGUSR1)
		proxy_shutdown(&ph);
}